

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.hpp
# Opt level: O0

void __thiscall
boost::object_pool<test_handler_class,_boost::default_user_allocator_new_delete>::~object_pool
          (object_pool<test_handler_class,_boost::default_user_allocator_new_delete> *this)

{
  bool bVar1;
  size_type sVar2;
  char **ppcVar3;
  char *pcVar4;
  void **ppvVar5;
  undefined8 *in_RDI;
  PODptr<unsigned_long> PVar6;
  char *i;
  size_type partition_size;
  void *freed_iter;
  PODptr<unsigned_long> next;
  PODptr<unsigned_long> iter;
  pool<boost::default_user_allocator_new_delete> *in_stack_ffffffffffffff50;
  char *local_60;
  char *local_40;
  PODptr<unsigned_long> local_28;
  undefined4 local_c;
  
  bVar1 = details::PODptr<unsigned_long>::valid((PODptr<unsigned_long> *)0x27eae5);
  if (bVar1) {
    local_28.ptr = (char *)in_RDI[1];
    local_28.sz = in_RDI[2];
    local_40 = (char *)*in_RDI;
    sVar2 = pool<boost::default_user_allocator_new_delete>::alloc_size(in_stack_ffffffffffffff50);
    do {
      PVar6 = details::PODptr<unsigned_long>::next
                        ((PODptr<unsigned_long> *)in_stack_ffffffffffffff50);
      ppcVar3 = details::PODptr<unsigned_long>::begin(&local_28);
      local_60 = *ppcVar3;
      while( true ) {
        pcVar4 = details::PODptr<unsigned_long>::end((PODptr<unsigned_long> *)0x27ebb6);
        if (local_60 == pcVar4) break;
        if (local_60 == local_40) {
          ppvVar5 = nextof(local_40);
          local_40 = (char *)*ppvVar5;
        }
        local_60 = local_60 + sVar2;
      }
      in_stack_ffffffffffffff50 =
           (pool<boost::default_user_allocator_new_delete> *)
           details::PODptr<unsigned_long>::begin(&local_28);
      default_user_allocator_new_delete::free
                ((in_stack_ffffffffffffff50->super_simple_segregated_storage<unsigned_long>).first);
      local_28 = PVar6;
      bVar1 = details::PODptr<unsigned_long>::valid((PODptr<unsigned_long> *)0x27ec59);
    } while (bVar1);
    details::PODptr<unsigned_long>::invalidate((PODptr<unsigned_long> *)0x27ec7b);
    local_c = 0;
  }
  else {
    local_c = 1;
  }
  pool<boost::default_user_allocator_new_delete>::~pool
            ((pool<boost::default_user_allocator_new_delete> *)0x27ec92);
  return;
}

Assistant:

object_pool<T, UserAllocator>::~object_pool()
{
#ifndef BOOST_POOL_VALGRIND
  // handle trivial case of invalid list.
  if (!this->list.valid())
    return;

  details::PODptr<size_type> iter = this->list;
  details::PODptr<size_type> next = iter;

  // Start 'freed_iter' at beginning of free list
  void * freed_iter = this->first;

  const size_type partition_size = this->alloc_size();

  do
  {
    // increment next
    next = next.next();

    // delete all contained objects that aren't freed.

    // Iterate 'i' through all chunks in the memory block.
    for (char * i = iter.begin(); i != iter.end(); i += partition_size)
    {
      // If this chunk is free,
      if (i == freed_iter)
      {
        // Increment freed_iter to point to next in free list.
        freed_iter = nextof(freed_iter);

        // Continue searching chunks in the memory block.
        continue;
      }

      // This chunk is not free (allocated), so call its destructor,
      static_cast<T *>(static_cast<void *>(i))->~T();
      // and continue searching chunks in the memory block.
    }

    // free storage.
    (UserAllocator::free)(iter.begin());

    // increment iter.
    iter = next;
  } while (iter.valid());

  // Make the block list empty so that the inherited destructor doesn't try to
  // free it again.
  this->list.invalidate();
#else
   // destruct all used elements:
   for(std::set<void*>::iterator pos = this->used_list.begin(); pos != this->used_list.end(); ++pos)
   {
      static_cast<T*>(*pos)->~T();
   }
   // base class will actually free the memory...
#endif
}